

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  uint local_1c;
  int count_local;
  int mask_local;
  lua_Hook func_local;
  lua_State *L_local;
  
  if ((func == (lua_Hook)0x0) || (local_1c = mask, _count_local = func, mask == 0)) {
    local_1c = 0;
    _count_local = (lua_Hook)0x0;
  }
  L->hook = _count_local;
  L->basehookcount = count;
  L->hookcount = L->basehookcount;
  L->hookmask = local_1c & 0xff;
  if (local_1c != 0) {
    settraps(L->ci);
  }
  return;
}

Assistant:

LUA_API void lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
  if (mask)
    settraps(L->ci);  /* to trace inside 'luaV_execute' */
}